

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_long,_long,_long,_long>
* fmt::v7::make_args_checked<unsigned_long&,long&,long&,long&,char_const*,char>
            (char **format_str,remove_reference_t<unsigned_long_&> *args,
            remove_reference_t<long_&> *args_1,remove_reference_t<long_&> *args_2,
            remove_reference_t<long_&> *args_3)

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_long,_long,_long,_long>
  *in_RDI;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_long,_long,_long,_long>
  *in_stack_00000030;
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_long,_long,_long,_long>
  ::format_arg_store(in_stack_00000030,(unsigned_long *)format_str,(long *)args,args_1,args_2);
  return in_RDI;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}